

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_growth_policy.h
# Opt level: O1

void __thiscall
tsl::rh::power_of_two_growth_policy<2UL>::power_of_two_growth_policy
          (power_of_two_growth_policy<2UL> *this,size_t *min_bucket_count_in_out)

{
  ulong uVar1;
  ulong uVar2;
  length_error *this_00;
  ulong uVar3;
  bool bVar4;
  
  uVar1 = *min_bucket_count_in_out;
  if (uVar1 < 0x8000000000000001) {
    uVar2 = 2;
    if (2 < uVar1) {
      uVar2 = uVar1;
    }
    *min_bucket_count_in_out = uVar2;
    uVar1 = uVar2 - 1;
    uVar3 = 1;
    if ((uVar2 & uVar1) != 0) {
      do {
        uVar1 = uVar1 >> ((byte)uVar3 & 0x3f) | uVar1;
        bVar4 = uVar3 < 0x20;
        uVar3 = uVar3 * 2;
      } while (bVar4);
      uVar2 = uVar1 + 1;
    }
    *min_bucket_count_in_out = uVar2;
    this->m_mask = uVar2 - 1;
    return;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"The hash table exceeds its maxmimum size.");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

power_of_two_growth_policy(std::size_t& min_bucket_count_in_out) {
        if(min_bucket_count_in_out > max_bucket_count()) {
            throw std::length_error("The hash table exceeds its maxmimum size.");
        }
        
        static_assert(MIN_BUCKETS_SIZE > 0, "MIN_BUCKETS_SIZE must be > 0.");
        const std::size_t min_bucket_count = MIN_BUCKETS_SIZE;
        
        min_bucket_count_in_out = std::max(min_bucket_count, min_bucket_count_in_out);
        min_bucket_count_in_out = round_up_to_power_of_two(min_bucket_count_in_out);
        m_mask = min_bucket_count_in_out - 1;
    }